

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O3

bool __thiscall
Diligent::Serializer<(Diligent::SerializerMode)1>::
SerializeArray<Diligent::ImmutableSamplerDesc_const*const,unsigned_int_const,bool(*)(Diligent::Serializer<(Diligent::SerializerMode)1>&,Diligent::ImmutableSamplerDesc_const&)>
          (Serializer<(Diligent::SerializerMode)1> *this,DynamicLinearAllocator *Allocator,
          ImmutableSamplerDesc **SrcArray,uint *Count,
          _func_bool_Serializer<(Diligent::SerializerMode)1>_ptr_ImmutableSamplerDesc_ptr
          *ElemSerializer)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  string msg;
  string local_50;
  
  bVar1 = (*Count == 0) != (*SrcArray != (ImmutableSamplerDesc *)0x0);
  if (!bVar1) {
    FormatString<char[26],char[38]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(SrcArray != nullptr) == (Count != 0)",
               (char (*) [38])CONCAT71((int7)((ulong)Count >> 8),bVar1));
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"SerializeArray",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x1bd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = Copy<unsigned_int_const>(this,Count,4);
  if (bVar1) {
    if (*Count == 0) {
      bVar1 = true;
    }
    else {
      lVar3 = 0;
      uVar2 = 0;
      do {
        bVar1 = (*ElemSerializer)(this,(ImmutableSamplerDesc *)
                                       ((long)((*SrcArray)->Desc).BorderColor + lVar3 + -0x2c));
        if (!bVar1) {
          return bVar1;
        }
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x48;
      } while (uVar2 < *Count);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Serializer<Mode>::SerializeArray(DynamicLinearAllocator* Allocator,
                                      ElemPtrType&            SrcArray,
                                      CountType&              Count,
                                      ArrayElemSerializerType ElemSerializer)
{
    VERIFY_EXPR((SrcArray != nullptr) == (Count != 0));

    if (!(*this)(Count))
        return false;

    for (size_t i = 0; i < static_cast<size_t>(Count); ++i)
    {
        if (!ElemSerializer(*this, SrcArray[i]))
            return false;
    }

    return true;
}